

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

string * google::protobuf::internal::StringTypeHandler::New(Arena *arena,string *value)

{
  string *this;
  
  if (arena == (Arena *)0x0) {
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this,(string *)value);
  }
  else {
    this = (string *)Arena::AllocateAligned(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20)
    ;
    std::__cxx11::string::string((string *)this,(string *)value);
    Arena::AddListNode(arena,this,arena_destruct_object<std::__cxx11::string>);
  }
  return this;
}

Assistant:

static inline string* New(Arena* arena, string&& value) {
    return Arena::Create<string>(arena, std::move(value));
  }